

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

ssize_t base64_decode_using_maps
                  (base64_maps_t *maps,char *dest,size_t destlen,char *src,size_t srclen)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  ssize_t sStack_40;
  
  if (destlen < (srclen + 3 >> 2) * 3) {
    piVar2 = __errno_location();
    *piVar2 = 0x4b;
LAB_003ddf93:
    sStack_40 = -1;
  }
  else {
    lVar4 = 0;
    for (; 4 < srclen; srclen = srclen - 4) {
      iVar1 = base64_decode_quartet_using_maps(maps,dest,src);
      if (iVar1 == -1) goto LAB_003ddf93;
      lVar4 = lVar4 + -3;
      dest = dest + 3;
      src = src + 4;
    }
    iVar1 = base64_decode_tail_using_maps(maps,dest,src,srclen);
    sStack_40 = -1;
    if (iVar1 != -1) {
      lVar3 = (long)iVar1;
      sStack_40 = lVar3 - lVar4;
      memset(dest + lVar3,0,(destlen - lVar3) + lVar4);
    }
  }
  return sStack_40;
}

Assistant:

ssize_t base64_decode_using_maps(const base64_maps_t *maps,
				 char *dest, const size_t destlen,
				 const char *src, const size_t srclen)
{
	ssize_t dest_offset = 0;
	ssize_t i;
	size_t more;

	if (destlen < base64_decoded_length(srclen)) {
		errno = EOVERFLOW;
		return -1;
	}

	for(i=0; srclen - i > 4; i+=4) {
		if (base64_decode_quartet_using_maps(maps, &dest[dest_offset], &src[i]) == -1) {
			return -1;
		}
		dest_offset += 3;
	}

	more = base64_decode_tail_using_maps(maps, &dest[dest_offset], &src[i], srclen - i);
	if (more == -1) {
		return -1;
	}
	dest_offset += more;

	memset(&dest[dest_offset], '\0', destlen-dest_offset);

	return dest_offset;
}